

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint64(CodedInputStream *this,uint64_t *value)

{
  pair<unsigned_long,_bool> pVar1;
  pair<unsigned_long,_bool> p;
  uint64_t *value_local;
  CodedInputStream *this_local;
  
  if ((this->buffer_ < this->buffer_end_) && (*this->buffer_ < 0x80)) {
    *value = (ulong)*this->buffer_;
    Advance(this,1);
    this_local._7_1_ = true;
  }
  else {
    pVar1 = ReadVarint64Fallback(this);
    *value = pVar1.first;
    this_local._7_1_ = (bool)(pVar1.second & 1);
  }
  return this_local._7_1_;
}

Assistant:

inline bool CodedInputStream::ReadVarint64(uint64_t* value) {
  if (PROTOBUF_PREDICT_TRUE(buffer_ < buffer_end_) && *buffer_ < 0x80) {
    *value = *buffer_;
    Advance(1);
    return true;
  }
  std::pair<uint64_t, bool> p = ReadVarint64Fallback();
  *value = p.first;
  return p.second;
}